

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

bool __thiscall Jinx::Impl::Parser::IsSymbolValid(Parser *this,SymbolListCItr symbol)

{
  bool bVar1;
  pointer pSVar2;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_28;
  Parser *local_20;
  Parser *this_local;
  SymbolListCItr symbol_local;
  
  if ((this->m_error & 1U) == 0) {
    local_20 = this;
    this_local = (Parser *)symbol._M_current;
    local_28._M_current =
         (Symbol *)
         std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                   (this->m_symbolList);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                        *)&this_local,&local_28);
    if (bVar1) {
      symbol_local._M_current._7_1_ = false;
    }
    else {
      pSVar2 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                             *)&this_local);
      if (pSVar2->type == NewLine) {
        symbol_local._M_current._7_1_ = false;
      }
      else {
        symbol_local._M_current._7_1_ = true;
      }
    }
  }
  else {
    symbol_local._M_current._7_1_ = false;
  }
  return symbol_local._M_current._7_1_;
}

Assistant:

inline_t bool Parser::IsSymbolValid(SymbolListCItr symbol) const
	{
		if (m_error)
			return false;
		if (symbol == m_symbolList.end())
			return false;
		if (symbol->type == SymbolType::NewLine)
			return false;
		return true;
	}